

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int shared_getaddr(int id,char **address)

{
  int iVar1;
  char local_26;
  char acStack_25 [7];
  char segname [10];
  int i;
  char **address_local;
  int id_local;
  
  if (shared_gt == (SHARED_GTAB *)0x0) {
    address_local._4_4_ = 0x9a;
  }
  else if (shared_lt == (SHARED_LTAB *)0x0) {
    address_local._4_4_ = 0x9a;
  }
  else {
    unique0x100000cf = address;
    strcpy(&local_26,"h");
    snprintf(acStack_25,9,"%d",(ulong)(uint)id);
    iVar1 = smem_open(&local_26,0,(int *)(segname + 2));
    if (iVar1 == 0) {
      *stack0xffffffffffffffe8 = (char *)(shared_lt[(int)segname._2_4_].p + 3);
      address_local._4_4_ = 0;
    }
    else {
      address_local._4_4_ = 0x97;
    }
  }
  return address_local._4_4_;
}

Assistant:

int     shared_getaddr(int id, char **address)
 { int i;
   char segname[10];

   if (NULL == shared_gt) return(SHARED_NOTINIT);       /* not initialized */
   if (NULL == shared_lt) return(SHARED_NOTINIT);       /* not initialized */
 
   strcpy(segname,"h");
   snprintf(segname+1,9,"%d", id);
 
   if (smem_open(segname,0,&i)) return(SHARED_BADARG);
 
   *address = ((char *)(((DAL_SHM_SEGHEAD *)(shared_lt[i].p + 1)) + 1));
 /*  smem_close(i); */
   return(SHARED_OK);
 }